

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O2

void __thiscall
xLearn::FMScore::calc_grad_adagrad(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  real_t *prVar4;
  pointer pNVar5;
  float fVar6;
  pointer pNVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar14 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar15 [64];
  float fVar16;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_ZMM8 [64];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_75;
  real_t local_74;
  real_t local_70;
  value_type local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  auVar22 = in_ZMM8._0_16_;
  auVar15._4_60_ = in_register_00001244;
  auVar15._0_4_ = norm;
  auVar14._4_60_ = in_register_00001204;
  auVar14._0_4_ = pg;
  auVar13 = auVar14._0_16_;
  local_74 = pg;
  local_70 = norm;
  if (norm < 0.0) {
    fVar6 = sqrtf(norm);
    auVar13 = ZEXT416((uint)local_74);
  }
  else {
    auVar17 = vsqrtss_avx(auVar15._0_16_,auVar15._0_16_);
    fVar6 = auVar17._0_4_;
  }
  prVar4 = model->param_w_;
  uVar3 = model->num_feat_;
  pNVar7 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar5 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_start; pNVar5 != pNVar7; pNVar5 = pNVar5 + 1) {
    if (pNVar5->feat_id < uVar3) {
      uVar8 = (ulong)(pNVar5->feat_id * 2);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * auVar13._0_4_ * pNVar5->feat_val)),
                                ZEXT416((uint)prVar4[uVar8]),
                                ZEXT416((uint)(this->super_Score).regu_lambda_));
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)prVar4[uVar8 + 1]),auVar21,auVar21);
      fVar16 = auVar17._0_4_;
      prVar4[uVar8 + 1] = fVar16;
      fVar11 = (float)(0x5f375a86 - ((int)fVar16 >> 1));
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar16 * -0.5 * fVar11)),ZEXT416((uint)fVar11),
                                SUB6416(ZEXT464(0x3fc00000),0));
      auVar17 = vfnmadd213ss_fma(ZEXT416((uint)(auVar21._0_4_ * (this->super_Score).learning_rate_))
                                 ,ZEXT416((uint)(auVar17._0_4_ * fVar11)),
                                 ZEXT416((uint)prVar4[uVar8]));
      prVar4[uVar8] = auVar17._0_4_;
    }
  }
  prVar4 = model->param_b_;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)prVar4[1]),auVar13,auVar13);
  fVar11 = auVar17._0_4_;
  prVar4[1] = fVar11;
  fVar6 = (float)(0x5f375a86 - ((int)fVar11 >> 1));
  auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar11 * -0.5 * fVar6)),ZEXT416((uint)fVar6),
                            ZEXT416(0x3fc00000));
  auVar13 = vfnmadd213ss_fma(ZEXT416((uint)(auVar13._0_4_ * (this->super_Score).learning_rate_)),
                             ZEXT416((uint)(auVar17._0_4_ * fVar6)),ZEXT416((uint)*prVar4));
  *prVar4 = auVar13._0_4_;
  auVar13 = vcvtusi2ss_avx512f(auVar22,model->num_K_);
  local_58._0_4_ = (this->super_Score).learning_rate_;
  local_58._4_4_ = (this->super_Score).regu_lambda_;
  local_58._8_4_ = (this->super_Score).alpha_;
  local_58._12_4_ = (this->super_Score).beta_;
  auVar13 = ZEXT416((uint)(auVar13._0_4_ * 0.25));
  auVar13 = vroundss_avx(auVar13,auVar13,10);
  iVar12 = vcvttss2usi_avx512f(auVar13);
  uVar8 = (ulong)(uint)(iVar12 << 2);
  auVar13 = vcvtusi2ss_avx512f(auVar22,iVar12 << 2);
  auVar22 = vcvtusi2ss_avx512f(auVar22,model->aux_size_);
  local_68._0_4_ = (this->super_Score).regu_lambda_;
  local_68._4_4_ = (this->super_Score).alpha_;
  local_68._8_4_ = (this->super_Score).beta_;
  local_68._12_4_ = (this->super_Score).lambda_1_;
  local_6c = 0.0;
  iVar12 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar22._0_4_ * auVar13._0_4_)));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,uVar8,&local_6c,&local_75);
  for (pNVar5 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pNVar5 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_finish; pNVar5 = pNVar5 + 1) {
    uVar10 = pNVar5->feat_id;
    if (uVar10 < uVar3) {
      fVar6 = local_70 * pNVar5->feat_val;
      prVar4 = model->param_v_;
      for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 4) {
        pfVar1 = prVar4 + uVar10 * iVar12 + uVar9;
        pfVar2 = local_48._M_impl.super__Vector_impl_data._M_start + uVar9;
        auVar13._0_4_ = fVar6 * *pfVar1 + *pfVar2;
        auVar13._4_4_ = fVar6 * pfVar1[1] + pfVar2[1];
        auVar13._8_4_ = fVar6 * pfVar1[2] + pfVar2[2];
        auVar13._12_4_ = fVar6 * pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])(local_48._M_impl.super__Vector_impl_data._M_start + uVar9) = auVar13;
      }
    }
  }
  for (pNVar7 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_start; pNVar7 != pNVar5; pNVar7 = pNVar7 + 1) {
    if (pNVar7->feat_id < uVar3) {
      fVar6 = local_70 * pNVar7->feat_val;
      uVar10 = pNVar7->feat_id * iVar12;
      prVar4 = model->param_v_;
      fVar11 = local_74 * fVar6;
      for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 4) {
        auVar13 = *(undefined1 (*) [16])(prVar4 + uVar10 + uVar9);
        auVar22._0_4_ = fVar6 * auVar13._0_4_;
        auVar22._4_4_ = fVar6 * auVar13._4_4_;
        auVar22._8_4_ = fVar6 * auVar13._8_4_;
        auVar22._12_4_ = fVar6 * auVar13._12_4_;
        auVar22 = vsubps_avx(*(undefined1 (*) [16])
                              (local_48._M_impl.super__Vector_impl_data._M_start + uVar9),auVar22);
        fVar16 = (float)local_68._0_4_ * auVar13._0_4_ + fVar11 * auVar22._0_4_;
        fVar18 = (float)local_68._0_4_ * auVar13._4_4_ + fVar11 * auVar22._4_4_;
        fVar19 = (float)local_68._0_4_ * auVar13._8_4_ + fVar11 * auVar22._8_4_;
        fVar20 = (float)local_68._0_4_ * auVar13._12_4_ + fVar11 * auVar22._12_4_;
        pfVar1 = prVar4 + (ulong)uVar10 + uVar8 + uVar9;
        auVar21._0_4_ = fVar16 * fVar16 + *pfVar1;
        auVar21._4_4_ = fVar18 * fVar18 + pfVar1[1];
        auVar21._8_4_ = fVar19 * fVar19 + pfVar1[2];
        auVar21._12_4_ = fVar20 * fVar20 + pfVar1[3];
        auVar22 = vrsqrtps_avx(auVar21);
        auVar17._0_4_ = (float)local_58._0_4_ * auVar22._0_4_ * fVar16;
        auVar17._4_4_ = (float)local_58._0_4_ * auVar22._4_4_ * fVar18;
        auVar17._8_4_ = (float)local_58._0_4_ * auVar22._8_4_ * fVar19;
        auVar17._12_4_ = (float)local_58._0_4_ * auVar22._12_4_ * fVar20;
        auVar13 = vsubps_avx(auVar13,auVar17);
        *(undefined1 (*) [16])(prVar4 + uVar10 + uVar9) = auVar13;
        *(undefined1 (*) [16])(prVar4 + (ulong)uVar10 + uVar8 + uVar9) = auVar21;
      }
      pNVar5 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void FMScore::calc_grad_adagrad(const SparseRow* row,
                                Model& model,
                                real_t pg,
                                real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
      iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*2];
    real_t &wlg = w[feat_id*2+1];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wlg += g*g;
    wl -= learning_rate_ * g * InvSqrt(wlg);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for(index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMwg = _mm_load_ps(w+aligned_k+d);
      __m128 XMMg = _mm_add_ps(_mm_mul_ps(XMMlamb, XMMw),
      _mm_mul_ps(XMMpgv, _mm_sub_ps(XMMs,
        _mm_mul_ps(XMMw, XMMv))));
      XMMwg = _mm_add_ps(XMMwg, _mm_mul_ps(XMMg, XMMg));
      XMMw = _mm_sub_ps(XMMw,
             _mm_mul_ps(XMMlr,
             _mm_mul_ps(_mm_rsqrt_ps(XMMwg), XMMg)));
      _mm_store_ps(w+d, XMMw);
      _mm_store_ps(w+aligned_k+d, XMMwg);
    }
  }
}